

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseLdexp::test(ShaderBitfieldOperationCaseLdexp *this,Data *data)

{
  float fVar1;
  int local_24;
  float expected;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseLdexp *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->m_components <= local_24) {
      return true;
    }
    fVar1 = deFloatLdExp(data->inVec4[local_24],data->inIvec4[local_24]);
    fVar1 = deFloatAbs(fVar1 - data->outVec4[local_24]);
    if (0.0001 < fVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			float expected = deFloatLdExp(data->inVec4[i], data->inIvec4[i]);
			if (deFloatAbs(expected - data->outVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}